

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::Parent::initRoot(Parent *this,uint key,uint leftChild,uint rightChild)

{
  uint rightChild_local;
  uint leftChild_local;
  uint key_local;
  Parent *this_local;
  
  compilerBarrier();
  MaybeUint::operator=(this->keys,key);
  this->children[0] = leftChild;
  this->children[1] = rightChild;
  azero<kj::_::BTreeImpl::MaybeUint>(this->keys + 1,6);
  azero<unsigned_int>(this->children + 2,6);
  return;
}

Assistant:

void BTreeImpl::Parent::initRoot(uint key, uint leftChild, uint rightChild) {
  // HACK: This is typically called on the root node immediately after copying its contents away,
  //   but the pointer used to copy it away may be a different pointer pointing to a different
  //   union member which the compiler may not recgonize as aliasing with this object. Just to
  //   be extra-safe, insert a compiler barrier.
  compilerBarrier();

  keys[0] = key;
  children[0] = leftChild;
  children[1] = rightChild;
  azero(keys + 1, Parent::NKEYS - 1);
  azero(children + 2, Parent::NCHILDREN - 2);
}